

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O2

double aom_highbd_ssim2(uint8_t *img1,uint8_t *img2,int stride_img1,int stride_img2,int width,
                       int height,uint32_t bd,uint32_t shift)

{
  byte bVar1;
  byte bVar2;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  uint16_t *r;
  long lVar3;
  uint16_t *s;
  int iVar4;
  double dVar5;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t local_8c;
  uint32_t sum_sq_r;
  uint32_t sum_sq_s;
  uint32_t sum_r;
  uint32_t sum_s;
  double local_78;
  int local_6c;
  long local_68;
  long local_60;
  ulong local_58;
  uint16_t *local_50;
  uint16_t *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_40 = CONCAT44(in_register_00000014,stride_img1);
  local_38 = CONCAT44(in_register_0000000c,stride_img2);
  local_6c = height + -8;
  bVar1 = (byte)shift;
  bVar2 = bVar1 * '\x02';
  r = (uint16_t *)((long)img2 * 2);
  local_68 = (long)(stride_img2 * 4) * 2;
  s = (uint16_t *)((long)img1 * 2);
  local_60 = (long)(stride_img1 * 4) * 2;
  local_78 = 0.0;
  iVar4 = 0;
  for (local_58 = 0; (int)local_58 <= local_6c; local_58 = (ulong)((int)local_58 + 4)) {
    local_50 = s;
    local_48 = r;
    for (lVar3 = 0; lVar3 <= width + -8; lVar3 = lVar3 + 4) {
      sum_s = 0;
      sum_r = 0;
      sum_sq_s = 0;
      sum_sq_r = 0;
      local_8c = 0;
      aom_highbd_ssim_parms_8x8_c
                (s,(int)local_40,r,(int)local_38,&sum_s,&sum_r,&sum_sq_s,&sum_sq_r,&local_8c);
      dVar5 = similarity(sum_s >> (bVar1 & 0x1f),sum_r >> (bVar1 & 0x1f),sum_sq_s >> (bVar2 & 0x1f),
                         sum_sq_r >> (bVar2 & 0x1f),local_8c >> (bVar2 & 0x1f),bd,
                         in_stack_ffffffffffffff68);
      local_78 = local_78 + dVar5;
      iVar4 = iVar4 + 1;
      r = r + 4;
      s = s + 4;
    }
    r = (uint16_t *)((long)local_48 + local_68);
    s = (uint16_t *)((long)local_50 + local_60);
  }
  return local_78 / (double)iVar4;
}

Assistant:

double aom_highbd_ssim2(const uint8_t *img1, const uint8_t *img2,
                        int stride_img1, int stride_img2, int width, int height,
                        uint32_t bd, uint32_t shift) {
  int i, j;
  int samples = 0;
  double ssim_total = 0;

  // sample point start with each 4x4 location
  for (i = 0; i <= height - 8;
       i += 4, img1 += stride_img1 * 4, img2 += stride_img2 * 4) {
    for (j = 0; j <= width - 8; j += 4) {
      double v = highbd_ssim_8x8(CONVERT_TO_SHORTPTR(img1 + j), stride_img1,
                                 CONVERT_TO_SHORTPTR(img2 + j), stride_img2, bd,
                                 shift);
      ssim_total += v;
      samples++;
    }
  }
  ssim_total /= samples;
  return ssim_total;
}